

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

size_t qHash<std::pair<QString,QString>>(QList<std::pair<QString,_QString>_> *key,size_t seed)

{
  pair<QString,_QString> *ppVar1;
  unsigned_long uVar2;
  
  ppVar1 = (key->d).ptr;
  uVar2 = std::
          accumulate<QList<std::pair<QString,QString>>::const_iterator,unsigned_long,QtPrivate::QHashCombine>
                    (ppVar1,ppVar1 + (key->d).size,seed);
  return uVar2;
}

Assistant:

size_t qHash(const QList<T> &key, size_t seed = 0)
    noexcept(noexcept(qHashRange(key.cbegin(), key.cend(), seed)))
{
    return qHashRange(key.cbegin(), key.cend(), seed);
}